

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_SUMMON(effect_handler_context_t_conflict *context)

{
  short sVar1;
  wchar_t wVar2;
  loc grid;
  loc grid_00;
  loc grid_01;
  wchar_t wVar3;
  wchar_t type;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  uint32_t uVar7;
  monster *pmVar8;
  player *ppVar9;
  uint uVar10;
  char *pcVar11;
  int iVar12;
  int iVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  bool bVar16;
  
  wVar3 = effect_calculate_value(context,false);
  wVar14 = context->subtype;
  iVar12 = context->other;
  type = summon_message_type(wVar14);
  wVar4 = summon_fallback_type(wVar14);
  sound(type);
  if (player->upkeep->arena_level == false) {
    if ((context->origin).what == SRC_MONSTER) {
      pmVar8 = cave_monster(cave,(context->origin).which.monster);
      if (pmVar8 == (monster *)0x0) {
        __assert_fail("mon",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                      ,0x8d3,"_Bool effect_handler_SUMMON(effect_handler_context_t *)");
      }
      wVar5 = summon_name_to_idx("KIN");
      if (wVar14 == wVar5) {
        kin_base = pmVar8->race->base;
      }
      wVar2 = pmVar8->race->level;
      wVar5 = iVar12 + wVar2;
      iVar12 = 0;
      iVar13 = 0;
      for (wVar15 = L'\0';
          (uVar10 = (uint)player->depth, iVar12 < wVar2 * uVar10 && (wVar15 < wVar3));
          wVar15 = wVar15 + L'\x01') {
        grid.x = (pmVar8->grid).x;
        grid.y = (pmVar8->grid).y;
        wVar6 = summon_specific(grid,wVar5,wVar14,false,false);
        iVar12 = iVar12 + wVar6 * wVar6;
        iVar13 = iVar13 + (uint)(iVar12 != 0);
      }
      if (L'\xffffffff' < wVar4 && iVar13 == 0) {
        iVar13 = 0;
        for (wVar14 = L'\0'; (iVar12 < (short)uVar10 * wVar2 && (wVar14 < wVar3));
            wVar14 = wVar14 + L'\x01') {
          grid_01.x = (pmVar8->grid).x;
          grid_01.y = (pmVar8->grid).y;
          wVar15 = summon_specific(grid_01,wVar5,wVar4,false,false);
          iVar12 = iVar12 + wVar15 * wVar15;
          iVar13 = iVar13 + (uint)(iVar12 != 0);
          uVar10 = (uint)(ushort)player->depth;
        }
      }
      ppVar9 = player;
      if (iVar13 == 0) {
        msg("But nothing comes.");
        context->ident = true;
        return true;
      }
      context->ident = true;
    }
    else {
      iVar13 = 0;
      while (ppVar9 = player, bVar16 = wVar3 != L'\0', wVar3 = wVar3 + L'\xffffffff', bVar16) {
        sVar1 = player->depth;
        uVar7 = Rand_div(4);
        grid_00.x = (ppVar9->grid).x;
        grid_00.y = (ppVar9->grid).y;
        wVar4 = summon_specific(grid_00,sVar1 + iVar12,wVar14,true,uVar7 == 0);
        iVar13 = iVar13 + wVar4;
      }
      context->ident = true;
      ppVar9 = player;
      if (iVar13 == 0) {
        return true;
      }
    }
    if (ppVar9->timed[2] != 0) {
      pcVar11 = "something";
      if (1 < iVar13) {
        pcVar11 = "many things";
      }
      msgt(type,"You hear %s appear nearby.",pcVar11);
    }
  }
  return true;
}

Assistant:

bool effect_handler_SUMMON(effect_handler_context_t *context)
{
	int summon_max = effect_calculate_value(context, false);
	int summon_type = context->subtype;
	int level_boost = context->other;
	int message_type = summon_message_type(summon_type);
	int fallback_type = summon_fallback_type(summon_type);
	int count = 0, val = 0, attempts = 0;

	sound(message_type);

	/* No summoning in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Monster summon */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		int rlev;

		assert(mon);

		/* Set the kin_base if necessary */
		if (summon_type == summon_name_to_idx("KIN")) {
			kin_base = mon->race->base;
		}

		/* Continue summoning until we reach the current dungeon level */
		rlev = mon->race->level;
		while ((val < player->depth * rlev) && (attempts < summon_max)) {
			int temp;

			/* Get a monster */
			temp = summon_specific(mon->grid, rlev + level_boost, summon_type,
								   false, false);

			val += temp * temp;

			/* Increase the attempt in case no monsters were available. */
			attempts++;

			/* Increase count of summoned monsters */
			if (val > 0)
				count++;
		}

		/* If the summon failed and there's a fallback type, use that */
		if ((count == 0) && (fallback_type >= 0)) {
			attempts = 0;
			while ((val < player->depth * rlev) && (attempts < summon_max)) {
				int temp;

				/* Get a monster */
				temp = summon_specific(mon->grid, rlev + level_boost,
									   fallback_type, false, false);

				val += temp * temp;

				/* Increase the attempt in case no monsters were available. */
				attempts++;

				/* Increase count of summoned monsters */
				if (val > 0)
					count++;
			}
		}

		/* Summoner failed */
		if (!count)
			msg("But nothing comes.");
	} else {
		/* If not a monster summon, it's simple */
		while (summon_max) {
			count += summon_specific(player->grid, player->depth + level_boost,
									 summon_type, true, one_in_(4));
			summon_max--;
		}
	}

	/* Identify */
	context->ident = true;

	/* Message for the blind */
	if (count && player->timed[TMD_BLIND])
		msgt(message_type, "You hear %s appear nearby.",
			 (count > 1 ? "many things" : "something"));

	return true;
}